

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::toString<curi_status>(string *__return_storage_ptr__,anon_enum_32 *value)

{
  anon_enum_32 *value_local;
  
  Detail::makeString<curi_status>(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( const T& value ) {
    return Detail::makeString( value );
}